

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-time-dependent.h
# Opt level: O3

void __thiscall
dynamicgraph::SignalTimeDependent<double,_int>::~SignalTimeDependent
          (SignalTimeDependent<double,_int> *this)

{
  ~SignalTimeDependent(this);
  operator_delete(this,0xd8);
  return;
}

Assistant:

virtual ~SignalTimeDependent() {}